

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

Byte ppmd_read(void *p)

{
  archive_read *a;
  void *pvVar1;
  Byte *pBVar2;
  bool bVar3;
  Byte extraout_AL;
  Byte BVar4;
  void *pvVar5;
  ssize_t bytes_avail;
  ssize_t local_20;
  
  a = *p;
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0x4d88) < 1) {
    local_20 = 0;
    pvVar5 = __archive_read_ahead(a,*(long *)((long)pvVar1 + 0x4d98) + 1,&local_20);
    if ((pvVar5 == (void *)0x0) || (local_20 <= *(long *)((long)pvVar1 + 0x4d98))) {
      bVar3 = false;
      archive_set_error(&a->archive,0x54,"Truncated 7z file data");
      *(undefined4 *)((long)pvVar1 + 0x4db8) = 1;
      BVar4 = extraout_AL;
    }
    else {
      *(long *)((long)pvVar1 + 0x4d80) = *(long *)((long)pvVar1 + 0x4d80) + 1;
      BVar4 = *(Byte *)((long)pvVar5 + *(long *)((long)pvVar1 + 0x4d98));
      bVar3 = true;
    }
    if (!bVar3) {
      return '\0';
    }
  }
  else {
    pBVar2 = *(Byte **)((long)pvVar1 + 0x4d80);
    *(Byte **)((long)pvVar1 + 0x4d80) = pBVar2 + 1;
    BVar4 = *pBVar2;
  }
  *(long *)((long)pvVar1 + 0x4d88) = *(long *)((long)pvVar1 + 0x4d88) + -1;
  *(long *)((long)pvVar1 + 0x4d90) = *(long *)((long)pvVar1 + 0x4d90) + 1;
  *(long *)((long)pvVar1 + 0x4d98) = *(long *)((long)pvVar1 + 0x4d98) + 1;
  return BVar4;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in <= 0) {
		/*
		 * Ppmd7_DecodeSymbol might require reading multiple bytes
		 * and we are on boundary;
		 * last resort to read using __archive_read_ahead.
		 */
		ssize_t bytes_avail = 0;
		const uint8_t* data = __archive_read_ahead(a,
		    (size_t)zip->ppstream.stream_in+1, &bytes_avail);
		if(data == NULL || bytes_avail < zip->ppstream.stream_in+1) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7z file data");
			zip->ppstream.overconsumed = 1;
			return (0);
		}
		zip->ppstream.next_in++;
		b = data[zip->ppstream.stream_in];
	} else {
		b = *zip->ppstream.next_in++;
	}
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	zip->ppstream.stream_in++;
	return (b);
}